

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O1

void __thiscall aiMetadata::aiMetadata(aiMetadata *this,aiMetadata *rhs)

{
  aiString **ppaVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  aiString *paVar6;
  aiMetadataEntry *paVar7;
  void *pvVar8;
  undefined8 *puVar9;
  uint *puVar10;
  undefined4 *puVar11;
  long lVar12;
  char *pcVar13;
  aiString *paVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  aiString v;
  undefined4 local_454;
  uint local_434;
  undefined1 local_430 [1024];
  
  uVar16 = (ulong)rhs->mNumProperties;
  this->mNumProperties = rhs->mNumProperties;
  this->mKeys = (aiString *)0x0;
  this->mValues = (aiMetadataEntry *)0x0;
  paVar6 = (aiString *)operator_new__(uVar16 * 0x404);
  if (uVar16 != 0) {
    paVar14 = paVar6;
    do {
      paVar14->length = 0;
      paVar14->data[0] = '\0';
      memset(paVar14->data + 1,0x1b,0x3ff);
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar6 + uVar16);
  }
  ppaVar1 = &this->mKeys;
  this->mKeys = paVar6;
  uVar16 = (ulong)this->mNumProperties;
  if (uVar16 != 0) {
    lVar12 = 4;
    uVar15 = 0;
    do {
      paVar6 = rhs->mKeys;
      paVar14 = *ppaVar1;
      if (paVar14 != paVar6) {
        uVar3 = *(uint *)(paVar6->data + lVar12 + -8);
        *(uint *)(paVar14->data + lVar12 + -8) = uVar3;
        memcpy(paVar14->data + lVar12 + -4,paVar6->data + lVar12 + -4,(ulong)uVar3);
        (paVar14->data + lVar12 + -4)[uVar3] = '\0';
      }
      uVar15 = uVar15 + 1;
      uVar16 = (ulong)this->mNumProperties;
      lVar12 = lVar12 + 0x404;
    } while (uVar15 < uVar16);
  }
  paVar7 = (aiMetadataEntry *)operator_new__(uVar16 << 4);
  this->mValues = paVar7;
  if (this->mNumProperties != 0) {
    uVar16 = 0;
    do {
      this->mValues[uVar16].mType = rhs->mValues[uVar16].mType;
      paVar7 = rhs->mValues;
      switch(paVar7[uVar16].mType) {
      case AI_BOOL:
        pvVar8 = operator_new(1);
        this->mValues[uVar16].mData = pvVar8;
        *(undefined1 *)this->mValues[uVar16].mData = *rhs->mValues[uVar16].mData;
        break;
      case AI_INT32:
        uVar18 = *paVar7[uVar16].mData;
        puVar9 = (undefined8 *)operator_new(4);
        *(undefined4 *)puVar9 = uVar18;
        goto LAB_003d1078;
      case AI_UINT64:
        uVar2 = *paVar7[uVar16].mData;
        puVar9 = (undefined8 *)operator_new(8);
        *puVar9 = uVar2;
        goto LAB_003d1078;
      case AI_FLOAT:
        uVar18 = *paVar7[uVar16].mData;
        puVar9 = (undefined8 *)operator_new(4);
        *(undefined4 *)puVar9 = uVar18;
        goto LAB_003d1078;
      case AI_DOUBLE:
        uVar2 = *paVar7[uVar16].mData;
        puVar9 = (undefined8 *)operator_new(8);
        *puVar9 = uVar2;
LAB_003d1078:
        this->mValues[uVar16].mData = puVar9;
        break;
      case AI_AISTRING:
        local_434 = 0;
        local_430[0] = 0;
        memset(local_430 + 1,0x1b,0x3ff);
        uVar3 = rhs->mNumProperties;
        if ((ulong)uVar3 != 0) {
          paVar6 = *ppaVar1;
          uVar4 = paVar6[uVar16].length;
          pcVar13 = rhs->mKeys->data;
          lVar12 = 0;
          do {
            if ((((aiString *)(pcVar13 + -4))->length == uVar4) &&
               (iVar5 = bcmp(pcVar13,paVar6[uVar16].data,(ulong)((aiString *)(pcVar13 + -4))->length
                            ), iVar5 == 0)) {
              if (*(int *)((long)&paVar7->mType + lVar12) == 5) {
                puVar10 = *(uint **)((long)&paVar7->mData + lVar12);
                local_434 = *puVar10;
                memcpy(local_430,puVar10 + 1,(ulong)local_434);
                local_430[local_434] = 0;
              }
              break;
            }
            lVar12 = lVar12 + 0x10;
            pcVar13 = pcVar13 + 0x404;
          } while ((ulong)uVar3 << 4 != lVar12);
        }
        puVar10 = (uint *)operator_new(0x404);
        if (0x3fe < local_434) {
          local_434 = 0x3ff;
        }
        *puVar10 = local_434;
        memcpy(puVar10 + 1,local_430,(ulong)local_434);
        *(undefined1 *)((long)puVar10 + (ulong)local_434 + 4) = 0;
        this->mValues[uVar16].mData = puVar10;
        break;
      case AI_AIVECTOR3D:
        uVar3 = rhs->mNumProperties;
        local_454 = 0;
        if ((ulong)uVar3 == 0) {
          uVar17 = 0;
          uVar18 = 0;
        }
        else {
          paVar6 = *ppaVar1;
          uVar4 = paVar6[uVar16].length;
          pcVar13 = rhs->mKeys->data;
          lVar12 = 0;
          do {
            if ((((aiString *)(pcVar13 + -4))->length == uVar4) &&
               (iVar5 = bcmp(pcVar13,paVar6[uVar16].data,(ulong)((aiString *)(pcVar13 + -4))->length
                            ), iVar5 == 0)) {
              uVar17 = 0;
              uVar18 = 0;
              if (*(int *)((long)&paVar7->mType + lVar12) == 6) {
                puVar11 = *(undefined4 **)((long)&paVar7->mData + lVar12);
                uVar18 = *puVar11;
                uVar17 = puVar11[1];
                local_454 = puVar11[2];
              }
              goto LAB_003d1259;
            }
            lVar12 = lVar12 + 0x10;
            pcVar13 = pcVar13 + 0x404;
          } while ((ulong)uVar3 << 4 != lVar12);
          uVar17 = 0;
          uVar18 = 0;
        }
LAB_003d1259:
        puVar11 = (undefined4 *)operator_new(0xc);
        *puVar11 = uVar18;
        puVar11[1] = uVar17;
        puVar11[2] = local_454;
        this->mValues[uVar16].mData = puVar11;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < this->mNumProperties);
  }
  return;
}

Assistant:

aiMetadata( const aiMetadata &rhs )
    : mNumProperties( rhs.mNumProperties )
    , mKeys( nullptr )
    , mValues( nullptr ) {
        mKeys = new aiString[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>( mNumProperties ); ++i ) {
            mKeys[ i ] = rhs.mKeys[ i ];
        }
        mValues = new aiMetadataEntry[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>(mNumProperties); ++i ) {
            mValues[ i ].mType = rhs.mValues[ i ].mType;
            switch ( rhs.mValues[ i ].mType ) {
            case AI_BOOL:
                mValues[ i ].mData = new bool;
                ::memcpy( mValues[ i ].mData, rhs.mValues[ i ].mData, sizeof(bool) );
                break;
            case AI_INT32: {
                int32_t v;
                ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( int32_t ) );
                mValues[ i ].mData = new int32_t( v );
                }
                break;
            case AI_UINT64: {
                    uint64_t v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( uint64_t ) );
                    mValues[ i ].mData = new  uint64_t( v );
                }
                break;
            case AI_FLOAT: {
                    float v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( float ) );
                    mValues[ i ].mData = new float( v );
                }
                break;
            case AI_DOUBLE: {
                    double v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( double ) );
                    mValues[ i ].mData = new double( v );
                }
                break;
            case AI_AISTRING: {
                    aiString v;
                    rhs.Get<aiString>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiString( v );
                }
                break;
            case AI_AIVECTOR3D: {
                    aiVector3D v;
                    rhs.Get<aiVector3D>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiVector3D( v );
                }
                break;
#ifndef SWIG
            case FORCE_32BIT:
#endif
            default:
                break;
            }

        }
    }